

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O0

axbStatus_t axbOpBackendRegister(axbHandle_s *handle,axbOpBackend_s *ops)

{
  axbOpBackend_s **__ptr;
  axbOpBackend_s **ppaVar1;
  ulong local_28;
  size_t i;
  axbOpBackend_s **old_array;
  axbOpBackend_s *ops_local;
  axbHandle_s *handle_local;
  
  if (handle->opBackends_size == handle->opBackends_capacity) {
    __ptr = handle->opBackends;
    handle->opBackends_capacity = handle->opBackends_capacity << 1;
    ppaVar1 = (axbOpBackend_s **)malloc(handle->opBackends_capacity << 3);
    handle->opBackends = ppaVar1;
    for (local_28 = 0; local_28 < handle->opBackends_size; local_28 = local_28 + 1) {
      handle->opBackends[local_28] = __ptr[local_28];
    }
    free(__ptr);
  }
  handle->opBackends[handle->opBackends_size] = ops;
  handle->opBackends_size = handle->opBackends_size + 1;
  return 0;
}

Assistant:

axbStatus_t axbOpBackendRegister(struct axbHandle_s *handle, struct axbOpBackend_s *ops)
{
  // check if there is still room for another backend. If not, resize array:
  if (handle->opBackends_size == handle->opBackends_capacity) {
    struct axbOpBackend_s **old_array = handle->opBackends;
    handle->opBackends_capacity *= 2;
    handle->opBackends = malloc(handle->opBackends_capacity * sizeof(struct axbOpBackend_s *));

    // copy over existing backends:
    for (size_t i=0; i<handle->opBackends_size; ++i) handle->opBackends[i] = old_array[i];
    free(old_array);
  }

  handle->opBackends[handle->opBackends_size] = ops;
  handle->opBackends_size += 1;
  return 0;
}